

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

QGraphicsAnchor * __thiscall
QGraphicsAnchorLayoutPrivate::addAnchor
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *firstItem,AnchorPoint firstEdge,
          QGraphicsLayoutItem *secondItem,AnchorPoint secondEdge,qreal *spacing)

{
  QGraphicsLayoutItem *this_00;
  AnchorPoint AVar1;
  bool bVar2;
  AnchorPoint AVar3;
  AnchorPoint AVar4;
  QGraphicsLayoutItem *pQVar5;
  AnchorData *data;
  QGraphicsAnchor *this_01;
  char *pcVar6;
  long in_FS_OFFSET;
  undefined4 uVar7;
  undefined4 uVar8;
  char local_78 [24];
  char *local_60;
  AnchorPoint local_54;
  QGraphicsLayoutItem *local_50;
  AnchorPoint local_44;
  QGraphicsLayoutItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = secondEdge;
  local_50 = secondItem;
  local_44 = firstEdge;
  local_40 = firstItem;
  if ((firstItem == (QGraphicsLayoutItem *)0x0) || (secondItem == (QGraphicsLayoutItem *)0x0)) {
    pcVar6 = "QGraphicsAnchorLayout::addAnchor(): Cannot anchor NULL items";
  }
  else if (firstItem == secondItem) {
    pcVar6 = "QGraphicsAnchorLayout::addAnchor(): Cannot anchor the item to itself";
  }
  else if (2 < (int)firstEdge == (int)secondEdge < 3) {
    pcVar6 = "QGraphicsAnchorLayout::addAnchor(): Cannot anchor edges of different orientations";
  }
  else {
    this_00 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
    pQVar5 = QGraphicsLayoutItem::parentLayoutItem(this_00);
    if ((pQVar5 != firstItem) && (pQVar5 != secondItem)) {
      if (this_00 != firstItem) {
        bVar2 = QListSpecialMethodsBase<QGraphicsLayoutItem*>::contains<QGraphicsLayoutItem*>
                          ((QListSpecialMethodsBase<QGraphicsLayoutItem*> *)&this->items,&local_40);
        if (!bVar2) {
          createItemEdges(this,local_40);
          QGraphicsLayoutPrivate::addChildLayoutItem(&this->super_QGraphicsLayoutPrivate,local_40);
        }
      }
      if (this_00 != secondItem) {
        bVar2 = QListSpecialMethodsBase<QGraphicsLayoutItem*>::contains<QGraphicsLayoutItem*>
                          ((QListSpecialMethodsBase<QGraphicsLayoutItem*> *)&this->items,&local_50);
        if (!bVar2) {
          createItemEdges(this,local_50);
          QGraphicsLayoutPrivate::addChildLayoutItem(&this->super_QGraphicsLayoutPrivate,local_50);
        }
      }
      createCenterAnchors(this,local_40,firstEdge);
      createCenterAnchors(this,local_50,secondEdge);
      correctEdgeDirection(this,&local_40,&local_44,&local_50,&local_54);
      data = (AnchorData *)operator_new(0x80);
      (data->super_QSimplexVariable).result = 0.0;
      (data->super_QSimplexVariable).index = 0;
      data->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_007eb0a0;
      data->from = (AnchorVertex *)0x0;
      data->to = (AnchorVertex *)0x0;
      data->minSize = 0.0;
      data->prefSize = 0.0;
      data->maxSize = 0.0;
      data->minPrefSize = 0.0;
      data->maxPrefSize = 0.0;
      data->sizeAtMinimum = 0.0;
      data->sizeAtPreferred = 0.0;
      data->sizeAtMaximum = 0.0;
      data->item = (QGraphicsLayoutItem *)0x0;
      data->graphicsAnchor = (QGraphicsAnchor *)0x0;
      data->field_0x78 = 0;
      this_01 = (QGraphicsAnchor *)acquireGraphicsAnchor(this,data);
      AVar4 = local_44;
      AVar1 = local_54;
      addAnchor_helper(this,local_40,local_44,local_50,local_54,data);
      if (spacing == (qreal *)0x0) {
        if ((local_40 != this_00) && (local_50 != this_00)) {
          AVar3 = AVar4 - AnchorTop;
          if ((int)AVar4 < 3) {
            AVar3 = AVar4;
          }
          if (AVar3 != AnchorHorizontalCenter) {
            AVar4 = oppositeEdge(AVar4);
            if (AVar4 == AVar1) {
              QGraphicsAnchor::unsetSpacing(this_01);
              goto LAB_0055dcf9;
            }
          }
        }
        uVar7 = 0;
        uVar8 = 0;
      }
      else {
        uVar7 = SUB84(*spacing,0);
        uVar8 = (undefined4)((ulong)*spacing >> 0x20);
      }
      QGraphicsAnchor::setSpacing(this_01,(qreal)CONCAT44(uVar8,uVar7));
      goto LAB_0055dcf9;
    }
    pcVar6 = 
    "QGraphicsAnchorLayout::addAnchor(): You cannot add the parent of the layout to the layout.";
  }
  local_60 = "default";
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0] = '\x02';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  this_01 = (QGraphicsAnchor *)0x0;
  QMessageLogger::warning(local_78,pcVar6);
LAB_0055dcf9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QGraphicsAnchor *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsAnchor *QGraphicsAnchorLayoutPrivate::addAnchor(QGraphicsLayoutItem *firstItem,
                                                         Qt::AnchorPoint firstEdge,
                                                         QGraphicsLayoutItem *secondItem,
                                                         Qt::AnchorPoint secondEdge,
                                                         qreal *spacing)
{
    Q_Q(QGraphicsAnchorLayout);
    if ((firstItem == nullptr) || (secondItem == nullptr)) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor NULL items");
        return nullptr;
    }

    if (firstItem == secondItem) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor the item to itself");
        return nullptr;
    }

    if (edgeOrientation(secondEdge) != edgeOrientation(firstEdge)) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor edges of different orientations");
        return nullptr;
    }

    const QGraphicsLayoutItem *parentWidget = q->parentLayoutItem();
    if (firstItem == parentWidget || secondItem == parentWidget) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "You cannot add the parent of the layout to the layout.");
        return nullptr;
    }

    // In QGraphicsAnchorLayout, items are represented in its internal
    // graph as four anchors that connect:
    //  - Left -> HCenter
    //  - HCenter-> Right
    //  - Top -> VCenter
    //  - VCenter -> Bottom

    // Ensure that the internal anchors have been created for both items.
    if (firstItem != q && !items.contains(firstItem)) {
        createItemEdges(firstItem);
        addChildLayoutItem(firstItem);
    }
    if (secondItem != q && !items.contains(secondItem)) {
        createItemEdges(secondItem);
        addChildLayoutItem(secondItem);
    }

    // Create center edges if needed
    createCenterAnchors(firstItem, firstEdge);
    createCenterAnchors(secondItem, secondEdge);

    // Use heuristics to find out what the user meant with this anchor.
    correctEdgeDirection(firstItem, firstEdge, secondItem, secondEdge);

    AnchorData *data = new AnchorData;
    QGraphicsAnchor *graphicsAnchor = acquireGraphicsAnchor(data);

    addAnchor_helper(firstItem, firstEdge, secondItem, secondEdge, data);

    if (spacing) {
        graphicsAnchor->setSpacing(*spacing);
    } else {
        // If firstItem or secondItem is the layout itself, the spacing will default to 0.
        // Otherwise, the following matrix is used (questionmark means that the spacing
        // is queried from the style):
        //                from
        //  to      Left    HCenter Right
        //  Left    0       0       ?
        //  HCenter 0       0       0
        //  Right   ?       0       0
        if (firstItem == q
            || secondItem == q
            || pickEdge(firstEdge, Qt::Horizontal) == Qt::AnchorHorizontalCenter
            || oppositeEdge(firstEdge) != secondEdge) {
            graphicsAnchor->setSpacing(0);
        } else {
            graphicsAnchor->unsetSpacing();
        }
    }

    return graphicsAnchor;
}